

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *outf_00;
  int iVar1;
  FILE *outf;
  int rc;
  char **argv_local;
  int argc_local;
  
  outf_00 = _stdout;
  initalizeAtomTbl();
  initStdConnTable();
  inputfilename[0] = '\0';
  iVar1 = mainProbeProc(argc,argv,outf_00);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
   int rc = 0;
   FILE *outf = stdout;

   initalizeAtomTbl(); /*atomprops.c*/
   initStdConnTable(); /*stdconntable.c*/

   inputfilename[0] = '\0'; /*global dcr041023*/
   rc = mainProbeProc(argc, argv, outf);
   return rc;
}